

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::GetnUniformTest::iterate(GetnUniformTest *this)

{
  RenderContext *pRVar1;
  Context *pCVar2;
  GLuint GVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  GLint GVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  char *pcVar9;
  TestContext *this_00;
  qpTestResult qVar10;
  allocator<char> local_18d;
  allocator<char> local_18c;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  GLint input3i [3];
  GLuint result4ui [4];
  GLfloat result4f [4];
  GLint result3i [3];
  GLuint input4ui [4];
  GLfloat input4f [4];
  Program program;
  string local_88;
  string local_68;
  string local_48;
  undefined4 extraout_var_02;
  
  bVar4 = checkExtension((this->super_TestCase).m_context,"GL_KHR_robustness");
  if ((!bVar4) ||
     (bVar4 = checkExtension((this->super_TestCase).m_context,"GL_KHR_robust_buffer_access_behavior"
                            ), !bVar4)) {
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    pcVar9 = "Not Supported";
    qVar10 = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_0098eec7:
    tcu::TestContext::setTestResult(this_00,qVar10,pcVar9);
    return STOP;
  }
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar1->_vptr_RenderContext[7])(pRVar1,"glGetnUniformfv");
  this->m_pGetnUniformfv = (PFNGLGETNUNIFORMFV)CONCAT44(extraout_var,iVar5);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar5 = (*pRVar1->_vptr_RenderContext[7])(pRVar1,"glGetnUniformiv");
  this->m_pGetnUniformiv = (PFNGLGETNUNIFORMIV)CONCAT44(extraout_var_00,iVar5);
  pcVar9 = "glGetnUniformuiv";
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[7])();
  this->m_pGetnUniformuiv = (PFNGLGETNUNIFORMUIV)CONCAT44(extraout_var_01,iVar5);
  pCVar2 = (this->super_TestCase).m_context;
  if ((((PFNGLGETNUNIFORMUIV)CONCAT44(extraout_var_01,iVar5) == (PFNGLGETNUNIFORMUIV)0x0) ||
      (this->m_pGetnUniformfv == (PFNGLGETNUNIFORMFV)0x0)) ||
     (this->m_pGetnUniformiv == (PFNGLGETNUNIFORMIV)0x0)) {
    this_00 = pCVar2->m_testCtx;
    pcVar9 = "Pointer to function glGetnUniform* is NULL.";
    qVar10 = QP_TEST_RESULT_INTERNAL_ERROR;
    goto LAB_0098eec7;
  }
  iVar5 = (*pCVar2->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var_02,iVar5);
  input4f[0] = 1.0;
  input4f[1] = 5.4;
  input4f[2] = 3.14159;
  input4f[3] = 1.28;
  input3i[0] = 10;
  input3i[1] = -0x14;
  input3i[2] = -0x1e;
  input4ui[0] = 10;
  input4ui[1] = 0x14;
  input4ui[2] = 0x1e;
  input4ui[3] = 0x28;
  program.m_compute.m_context = (this->super_TestCase).m_context;
  program.m_id = 0;
  program.m_compute.m_id = 0;
  program.m_fragment.m_id = 0;
  program.m_geometry.m_id = 0;
  program.m_tess_ctrl.m_id = 0;
  program.m_tess_eval.m_id = 0;
  program.m_vertex.m_id = 0;
  program.m_fragment.m_context = program.m_compute.m_context;
  program.m_geometry.m_context = program.m_compute.m_context;
  program.m_tess_ctrl.m_context = program.m_compute.m_context;
  program.m_tess_eval.m_context = program.m_compute.m_context;
  program.m_vertex.m_context = program.m_compute.m_context;
  program.m_context = program.m_compute.m_context;
  getComputeShader_abi_cxx11_(&local_68,(GetnUniformTest *)pcVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)result4f,glcts::fixed_sample_locations_values + 1,&local_189);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)result4ui,glcts::fixed_sample_locations_values + 1,&local_18a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)result3i,glcts::fixed_sample_locations_values + 1,&local_18b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,glcts::fixed_sample_locations_values + 1,&local_18c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,glcts::fixed_sample_locations_values + 1,&local_18d);
  RobustnessRobustBufferAccessBehavior::Program::Init
            (&program,&local_68,(string *)result4f,(string *)result4ui,(string *)result3i,&local_88,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)result3i);
  std::__cxx11::string::~string((string *)result4ui);
  std::__cxx11::string::~string((string *)result4f);
  RobustnessRobustBufferAccessBehavior::Program::Use(&program);
  GVar3 = program.m_id;
  (**(code **)(lVar8 + 0x1138))(program.m_id,0xb,1,input4f);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"ProgramUniform4fv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4d7);
  (**(code **)(lVar8 + 0x1108))(GVar3,0xc,1,input3i);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"ProgramUniform3iv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4da);
  (**(code **)(lVar8 + 0x1158))(GVar3,0xd,1,input4ui);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"ProgramUniform4uiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4dd);
  qVar10 = QP_TEST_RESULT_FAIL;
  (**(code **)(lVar8 + 0x528))(1,1,1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"DispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x4e0);
  (*this->m_pGetnUniformfv)(GVar3,0xb,0x10,result4f);
  bVar4 = verifyResult(this,input4f,result4f,0x10,"getnUniformfv [false negative]");
  if (bVar4) {
    GVar7 = (**(code **)(lVar8 + 0x800))();
    bVar4 = verifyError(this,GVar7,0,"getnUniformfv [false negative]");
  }
  else {
    bVar4 = false;
  }
  (*this->m_pGetnUniformfv)(GVar3,0xb,0xc,result4f);
  if (bVar4 == false) {
    bVar4 = false;
  }
  else {
    GVar7 = (**(code **)(lVar8 + 0x800))();
    bVar4 = verifyError(this,GVar7,0x502,"getnUniformfv [false positive]");
  }
  (*this->m_pGetnUniformiv)(GVar3,0xc,0xc,result3i);
  if ((bVar4 == false) ||
     (bVar4 = verifyResult(this,input3i,result3i,0xc,"getnUniformiv [false negative]"), !bVar4)) {
    bVar4 = false;
  }
  else {
    GVar7 = (**(code **)(lVar8 + 0x800))();
    bVar4 = verifyError(this,GVar7,0,"getnUniformiv [false negative]");
  }
  (*this->m_pGetnUniformiv)(GVar3,0xc,8,result3i);
  if (bVar4 == false) {
    bVar4 = false;
  }
  else {
    GVar7 = (**(code **)(lVar8 + 0x800))();
    bVar4 = verifyError(this,GVar7,0x502,"getnUniformiv [false positive]");
  }
  (*this->m_pGetnUniformuiv)(GVar3,0xd,0x10,result4ui);
  if ((bVar4 == false) ||
     (bVar4 = verifyResult(this,input4ui,result4ui,0x10,"getnUniformuiv [false negative]"), !bVar4))
  {
    bVar4 = false;
  }
  else {
    GVar7 = (**(code **)(lVar8 + 0x800))();
    bVar4 = verifyError(this,GVar7,0,"getnUniformuiv [false negative]");
  }
  (*this->m_pGetnUniformuiv)(GVar3,0xd,0xc,result4ui);
  if (bVar4 != false) {
    GVar7 = (**(code **)(lVar8 + 0x800))();
    bVar4 = verifyError(this,GVar7,0x502,"getnUniformuiv [false positive]");
    if (bVar4) {
      pcVar9 = "Pass";
      qVar10 = QP_TEST_RESULT_PASS;
      goto LAB_0098f069;
    }
  }
  pcVar9 = "Fail";
LAB_0098f069:
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,qVar10,pcVar9);
  std::__cxx11::string::~string((string *)&local_68);
  RobustnessRobustBufferAccessBehavior::Program::~Program(&program);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetnUniformTest::iterate()
{
	if (!checkExtension(m_context, "GL_KHR_robustness") ||
		!checkExtension(m_context, "GL_KHR_robust_buffer_access_behavior"))
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	m_pGetnUniformfv  = (PFNGLGETNUNIFORMFV)m_context.getRenderContext().getProcAddress("glGetnUniformfv");
	m_pGetnUniformiv  = (PFNGLGETNUNIFORMIV)m_context.getRenderContext().getProcAddress("glGetnUniformiv");
	m_pGetnUniformuiv = (PFNGLGETNUNIFORMUIV)m_context.getRenderContext().getProcAddress("glGetnUniformuiv");

	if ((DE_NULL == m_pGetnUniformfv) || (DE_NULL == m_pGetnUniformiv) || (DE_NULL == m_pGetnUniformuiv))
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR,
												 "Pointer to function glGetnUniform* is NULL.");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLfloat input4f[]  = { 1.0f, 5.4f, 3.14159f, 1.28f };
	const GLint   input3i[]  = { 10, -20, -30 };
	const GLuint  input4ui[] = { 10, 20, 30, 40 };

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	Program program(m_context);

	/* Compute Shader */
	const std::string& cs = getComputeShader();

	/* Shaders initialization */
	program.Init(cs /* cs */, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);
	program.Use();

	/* passing uniform values */
	gl.programUniform4fv(program.m_id, 11, 1, input4f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform4fv");

	gl.programUniform3iv(program.m_id, 12, 1, input3i);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform3iv");

	gl.programUniform4uiv(program.m_id, 13, 1, input4ui);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramUniform4uiv");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	/* veryfing gfetnUniform error messages */
	GLfloat result4f[4];
	GLint   result3i[3];
	GLuint  result4ui[4];

	m_pGetnUniformfv(program.m_id, 11, sizeof(GLfloat) * 4, result4f);
	test_result = test_result &&
				  verifyResult((void*)input4f, (void*)result4f, sizeof(GLfloat) * 4, "getnUniformfv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformfv [false negative]");

	m_pGetnUniformfv(program.m_id, 11, sizeof(GLfloat) * 3, result4f);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformfv [false positive]");

	m_pGetnUniformiv(program.m_id, 12, sizeof(GLint) * 3, result3i);
	test_result = test_result &&
				  verifyResult((void*)input3i, (void*)result3i, sizeof(GLint) * 3, "getnUniformiv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformiv [false negative]");

	m_pGetnUniformiv(program.m_id, 12, sizeof(GLint) * 2, result3i);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformiv [false positive]");

	m_pGetnUniformuiv(program.m_id, 13, sizeof(GLuint) * 4, result4ui);
	test_result = test_result && verifyResult((void*)input4ui, (void*)result4ui, sizeof(GLuint) * 4,
											  "getnUniformuiv [false negative]");
	test_result = test_result && verifyError(gl.getError(), GL_NO_ERROR, "getnUniformuiv [false negative]");

	m_pGetnUniformuiv(program.m_id, 13, sizeof(GLuint) * 3, result4ui);
	test_result = test_result && verifyError(gl.getError(), GL_INVALID_OPERATION, "getnUniformuiv [false positive]");

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}